

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O0

char * wabt::GetSectionName(BinarySection sec)

{
  char *pcStack_10;
  BinarySection sec_local;
  
  switch(sec) {
  case Custom:
    pcStack_10 = "Custom";
    break;
  case Type:
    pcStack_10 = "Type";
    break;
  case Import:
    pcStack_10 = "Import";
    break;
  case Function:
    pcStack_10 = "Function";
    break;
  case Table:
    pcStack_10 = "Table";
    break;
  case Memory:
    pcStack_10 = "Memory";
    break;
  case Global:
    pcStack_10 = "Global";
    break;
  case Export:
    pcStack_10 = "Export";
    break;
  case Start:
    pcStack_10 = "Start";
    break;
  case Elem:
    pcStack_10 = "Elem";
    break;
  case Code:
    pcStack_10 = "Code";
    break;
  case Data:
    pcStack_10 = "Data";
    break;
  case DataCount:
    pcStack_10 = "DataCount";
    break;
  case Last:
    pcStack_10 = "Tag";
    break;
  default:
    abort();
  }
  return pcStack_10;
}

Assistant:

const char* GetSectionName(BinarySection sec) {
  switch (sec) {
#define V(Name, name, code) \
  case BinarySection::Name: \
    return #Name;
    WABT_FOREACH_BINARY_SECTION(V)
#undef V
    default:
      WABT_UNREACHABLE;
  }
}